

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
HecrSequential_computeLinearSystemSize_Test::TestBody
          (HecrSequential_computeLinearSystemSize_Test *this)

{
  char *pcVar1;
  AssertHelper local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertionResult gtest_ar;
  
  local_28.ptr_._0_4_ = 1;
  local_30.data_._0_4_ = compute_linear_system_size(1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","compute_linear_system_size(1)",(int *)&local_28,
             (int *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x1e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_28.ptr_._0_4_ = 7;
  local_30.data_._0_4_ = compute_linear_system_size(4);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"7","compute_linear_system_size(4)",(int *)&local_28,
             (int *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x1f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_28.ptr_._0_4_ = 7;
  local_30.data_._0_4_ = compute_linear_system_size(7);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"7","compute_linear_system_size(7)",(int *)&local_28,
             (int *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x20,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_28.ptr_._0_4_ = 0xf;
  local_30.data_._0_4_ = compute_linear_system_size(8);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"15","compute_linear_system_size(8)",(int *)&local_28,
             (int *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x21,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(HecrSequential, computeLinearSystemSize)
{
    EXPECT_EQ(1, compute_linear_system_size(1));
    EXPECT_EQ(7, compute_linear_system_size(4));
    EXPECT_EQ(7, compute_linear_system_size(7));
    EXPECT_EQ(15, compute_linear_system_size(8));
}